

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O3

BOOL __thiscall
Js::JavascriptProxy::SetPropertyTrap
          (JavascriptProxy *this,Var receiver,SetPropertyTrapKind setPropertyTrapKind,
          PropertyId propertyId,Var newValue,ScriptContext *requestContext,
          PropertyOperationFlags propertyOperationFlags,BOOL skipPrototypeCheck)

{
  ImplicitCallFlags IVar1;
  ScriptContext *scriptContext;
  ThreadContext *this_00;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  Attributes attributes;
  BOOL BVar5;
  Var pvVar6;
  RecyclableObject *object;
  JavascriptFunction *pJVar7;
  undefined4 *puVar8;
  Var pvVar9;
  JavascriptMethod p_Var10;
  RecyclableObject *ptr;
  PropertyRecord *pPVar11;
  undefined1 local_a8 [8];
  PropertyDescriptor targetDescriptor;
  
  scriptContext =
       (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  ThreadContext::ProbeStack(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  this_00 = requestContext->threadContext;
  if ((this_00->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
    this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_External;
    return 0;
  }
  pvVar6 = CrossSite::MarshalVar(requestContext,(this->handler).ptr,false);
  if (pvVar6 == (Var)0x0) {
    bVar3 = ThreadContext::RecordImplicitException(this_00);
    if (!bVar3) {
      return 0;
    }
    JavascriptError::ThrowTypeError(requestContext,-0x7ff5ea15,L"set");
  }
  object = (RecyclableObject *)CrossSite::MarshalVar(requestContext,(this->target).ptr,false);
  pJVar7 = GetMethodHelper(this,0x19b,requestContext);
  bVar3 = Memory::Recycler::IsHeapEnumInProgress
                    (((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->
                        javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
                     recycler);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                ,0x73d,"(!GetScriptContext()->IsHeapEnumInProgress())",
                                "!GetScriptContext()->IsHeapEnumInProgress()");
    if (!bVar3) goto LAB_00cfdafd;
    *puVar8 = 0;
  }
  if (pJVar7 == (JavascriptFunction *)0x0) {
    switch(setPropertyTrapKind) {
    case SetItemOnTaggedNumberKind:
      BVar5 = ScriptContext::IsNumericPropertyId(requestContext,propertyId,(uint32 *)local_a8);
      if (BVar5 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                    ,0x747,"(isNumericPropertyId)","isNumericPropertyId");
        if (!bVar3) goto LAB_00cfdafd;
        *puVar8 = 0;
      }
      BVar5 = JavascriptOperators::SetItemOnTaggedNumber
                        (receiver,object,local_a8._0_4_,newValue,requestContext,
                         propertyOperationFlags);
      return BVar5;
    case SetPropertyOnTaggedNumberKind:
      BVar5 = JavascriptOperators::SetPropertyOnTaggedNumber
                        (receiver,object,propertyId,newValue,requestContext,propertyOperationFlags);
      return BVar5;
    case SetPropertyKind:
      BVar5 = JavascriptOperators::SetProperty
                        (receiver,object,propertyId,newValue,requestContext,propertyOperationFlags);
      return BVar5;
    case SetItemKind:
      BVar5 = ScriptContext::IsNumericPropertyId(requestContext,propertyId,(uint32 *)local_a8);
      if (BVar5 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                    ,0x752,"(isNumericPropertyId)","isNumericPropertyId");
        if (!bVar3) goto LAB_00cfdafd;
        *puVar8 = 0;
      }
      BVar5 = JavascriptOperators::SetItem
                        (receiver,object,local_a8._0_4_,newValue,requestContext,
                         propertyOperationFlags,skipPrototypeCheck);
      return BVar5;
    case SetPropertyWPCacheKind:
      local_a8 = (undefined1  [8])0x0;
      targetDescriptor.Value.ptr = (void *)0x50000ffff;
      targetDescriptor.Getter.ptr = (void *)0x0;
      targetDescriptor.Setter.ptr = (void *)0x0;
      targetDescriptor.originalVar.ptr = (void *)0x0;
      targetDescriptor.writableSpecified = false;
      targetDescriptor.enumerableSpecified = false;
      targetDescriptor.configurableSpecified = false;
      targetDescriptor.valueSpecified = false;
      targetDescriptor.getterSpecified = false;
      targetDescriptor.setterSpecified = false;
      targetDescriptor.Writable = false;
      targetDescriptor.Enumerable = false;
      targetDescriptor.Configurable = false;
      targetDescriptor.fromProxy = false;
      targetDescriptor._42_6_ = 0;
      BVar5 = JavascriptOperators::SetPropertyWPCache<int>
                        (receiver,object,propertyId,newValue,requestContext,propertyOperationFlags,
                         (PropertyValueInfo *)local_a8);
      return BVar5;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                ,0x75b,"(0)","0");
    if (!bVar3) {
LAB_00cfdafd:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar8 = 0;
  }
  pvVar9 = GetName(requestContext,propertyId);
  bVar3 = this_00->reentrancySafeOrHandled;
  this_00->reentrancySafeOrHandled = true;
  attributes = FunctionInfo::GetAttributes((RecyclableObject *)pJVar7);
  bVar4 = ThreadContext::HasNoSideEffect(this_00,(RecyclableObject *)pJVar7,attributes);
  if (bVar4) {
    ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
    if (this_00->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var10 = RecyclableObject::GetEntryPoint((RecyclableObject *)pJVar7);
    CheckIsExecutable((RecyclableObject *)pJVar7,p_Var10);
    p_Var10 = RecyclableObject::GetEntryPoint((RecyclableObject *)pJVar7);
    ptr = (RecyclableObject *)
          (*p_Var10)((RecyclableObject *)pJVar7,(CallInfo)pJVar7,0x2000005,0,0,0,0,0x2000005,pvVar6,
                     object,pvVar9,newValue,receiver);
    bVar4 = ThreadContext::IsOnStack(ptr);
LAB_00cfd618:
    if (bVar4 != false) {
      this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
    }
  }
  else if ((this_00->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag) {
    if ((attributes & HasNoSideEffect) != None) {
      ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
      if (this_00->noJsReentrancy == true) {
        Throw::FatalJsReentrancyError();
      }
      p_Var10 = RecyclableObject::GetEntryPoint((RecyclableObject *)pJVar7);
      CheckIsExecutable((RecyclableObject *)pJVar7,p_Var10);
      p_Var10 = RecyclableObject::GetEntryPoint((RecyclableObject *)pJVar7);
      ptr = (RecyclableObject *)
            (*p_Var10)((RecyclableObject *)pJVar7,(CallInfo)pJVar7,0x2000005,0,0,0,0,0x2000005,
                       pvVar6,object,pvVar9,newValue,receiver);
      bVar4 = ThreadContext::IsOnStack(ptr);
      goto LAB_00cfd618;
    }
    IVar1 = this_00->implicitCallFlags;
    ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
    if (this_00->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var10 = RecyclableObject::GetEntryPoint((RecyclableObject *)pJVar7);
    CheckIsExecutable((RecyclableObject *)pJVar7,p_Var10);
    p_Var10 = RecyclableObject::GetEntryPoint((RecyclableObject *)pJVar7);
    ptr = (RecyclableObject *)
          (*p_Var10)((RecyclableObject *)pJVar7,(CallInfo)pJVar7,0x2000005,0,0,0,0,0x2000005,pvVar6,
                     object,pvVar9,newValue,receiver);
    this_00->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
  }
  else {
    this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
    ptr = (((((((((pJVar7->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary)
               .ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->super_ScriptContextBase).
           javascriptLibrary)->super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  this_00->reentrancySafeOrHandled = bVar3;
  BVar5 = JavascriptConversion::ToBoolean(ptr,requestContext);
  if (BVar5 == 0) {
    BVar5 = 0;
    if ((propertyOperationFlags & PropertyOperation_StrictMode) != PropertyOperation_None) {
      pPVar11 = ScriptContext::GetPropertyName(requestContext,propertyId);
      JavascriptError::ThrowTypeErrorVar(requestContext,-0x7ff5e9d4,L"set",pPVar11 + 1);
    }
  }
  else {
    PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_a8);
    BVar5 = JavascriptOperators::GetOwnPropertyDescriptor
                      (object,propertyId,requestContext,(PropertyDescriptor *)local_a8);
    if (BVar5 != 0) {
      bVar3 = PropertyDescriptor::IsConfigurable((PropertyDescriptor *)local_a8);
      if (targetDescriptor.originalVar.ptr._3_1_ == '\x01') {
        if ((!bVar3) &&
           ((bVar3 = PropertyDescriptor::IsWritable((PropertyDescriptor *)local_a8), !bVar3 &&
            (bVar3 = JavascriptConversion::SameValueCommon<false>(newValue,(Var)local_a8), !bVar3)))
           ) {
LAB_00cfdb0e:
          JavascriptError::ThrowTypeError(requestContext,-0x7ff5ea14,L"set");
        }
      }
      else if ((!bVar3) &&
              (pJVar7 = (JavascriptFunction *)
                        PropertyDescriptor::GetSetter((PropertyDescriptor *)local_a8),
              pJVar7 == (((requestContext->super_ScriptContextBase).javascriptLibrary)->
                        super_JavascriptLibraryBase).defaultAccessorFunction.ptr))
      goto LAB_00cfdb0e;
    }
    this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_External;
    BVar5 = 1;
  }
  return BVar5;
}

Assistant:

BOOL JavascriptProxy::SetPropertyTrap(Var receiver, SetPropertyTrapKind setPropertyTrapKind, PropertyId propertyId, Var newValue, ScriptContext* requestContext, PropertyOperationFlags propertyOperationFlags, BOOL skipPrototypeCheck)
    {
        PROBE_STACK(GetScriptContext(), Js::Constants::MinStackDefault);

        // Reject implicit call
        ThreadContext* threadContext = requestContext->GetThreadContext();
        if (threadContext->IsDisableImplicitCall())
        {
            threadContext->AddImplicitCallFlags(Js::ImplicitCall_External);
            return FALSE;
        }

        //1. Assert: IsPropertyKey(P) is true.
        //2. Let handler be the value of the[[ProxyHandler]] internal slot of O.
        Js::RecyclableObject *handlerObj = this->MarshalHandler(requestContext);

        //3. If handler is null, then throw a TypeError exception.
        if (handlerObj == nullptr)
        {
            // the proxy has been revoked; TypeError.
            if (!threadContext->RecordImplicitException())
                return FALSE;
            JavascriptError::ThrowTypeError(requestContext, JSERR_ErrorOnRevokedProxy, _u("set"));
        }

        //4. Let target be the value of the[[ProxyTarget]] internal slot of O.
        Js::RecyclableObject *targetObj = this->MarshalTarget(requestContext);

        //5. Let trap be the result of GetMethod(handler, "set").
        //6. ReturnIfAbrupt(trap).
        //7. If trap is undefined, then
        //a.Return the result of calling the[[Set]] internal method of target with arguments P, V, and Receiver.
        JavascriptFunction* setMethod = GetMethodHelper(PropertyIds::set, requestContext);

        Assert(!GetScriptContext()->IsHeapEnumInProgress());
        if (nullptr == setMethod)
        {
            PropertyValueInfo info;
            switch (setPropertyTrapKind)
            {
            case SetPropertyTrapKind::SetItemOnTaggedNumberKind:
            {
                uint32 indexVal;
                BOOL isNumericPropertyId = requestContext->IsNumericPropertyId(propertyId, &indexVal);
                Assert(isNumericPropertyId);
                return JavascriptOperators::SetItemOnTaggedNumber(receiver, targetObj, indexVal, newValue, requestContext, propertyOperationFlags);
            }
            case SetPropertyTrapKind::SetPropertyOnTaggedNumberKind:
                return JavascriptOperators::SetPropertyOnTaggedNumber(receiver, targetObj, propertyId, newValue, requestContext, propertyOperationFlags);
            case SetPropertyTrapKind::SetPropertyKind:
                return JavascriptOperators::SetProperty(receiver, targetObj, propertyId, newValue, requestContext, propertyOperationFlags);
            case SetPropertyTrapKind::SetItemKind:
            {
                uint32 indexVal;
                BOOL isNumericPropertyId = requestContext->IsNumericPropertyId(propertyId, &indexVal);
                Assert(isNumericPropertyId);
                return  JavascriptOperators::SetItem(receiver, targetObj, indexVal, newValue, requestContext, propertyOperationFlags, skipPrototypeCheck);
            }
            case SetPropertyTrapKind::SetPropertyWPCacheKind:
            {
                PropertyValueInfo propertyValueInfo;
                return JavascriptOperators::SetPropertyWPCache(receiver, targetObj, propertyId, newValue, requestContext, propertyOperationFlags, &propertyValueInfo);
            }
            default:
                AnalysisAssert(FALSE);
            }
        }
        //8. Let trapResult be the result of calling the[[Call]] internal method of trap with handler as the this value and a new List containing target, P, V, and Receiver.
        //9. Let booleanTrapResult be ToBoolean(trapResult).
        //10. ReturnIfAbrupt(booleanTrapResult).
        //11. If booleanTrapResult is false, then return false.

        Var propertyName = GetName(requestContext, propertyId);

        Var setPropertyResult = threadContext->ExecuteImplicitCall(setMethod, ImplicitCall_Accessor, [=]()->Js::Var
        {
            return CALL_FUNCTION(threadContext, setMethod, CallInfo(CallFlags_Value, 5), handlerObj, targetObj, propertyName, newValue, receiver);
        });

        BOOL setResult = JavascriptConversion::ToBoolean(setPropertyResult, requestContext);
        if (!setResult)
        {
            if (propertyOperationFlags & PropertyOperation_StrictMode)
            {
                JavascriptError::ThrowTypeErrorVar(
                    requestContext,
                    JSERR_ProxyHandlerReturnedFalse,
                    _u("set"),
                    requestContext->GetPropertyName(propertyId)->GetBuffer()
                );
            }
            return setResult;
        }

        //12. Let targetDesc be the result of calling the[[GetOwnProperty]] internal method of target with argument P.
        //13. ReturnIfAbrupt(targetDesc).
        //14. If targetDesc is not undefined, then
        //a.If IsDataDescriptor(targetDesc) and targetDesc.[[Configurable]] is false and targetDesc.[[Writable]] is false, then
        //i.If SameValue(V, targetDesc.[[Value]]) is false, then throw a TypeError exception.
        //b.If IsAccessorDescriptor(targetDesc) and targetDesc.[[Configurable]] is false, then
        //i.If targetDesc.[[Set]] is undefined, then throw a TypeError exception.
        //15. Return true
        PropertyDescriptor targetDescriptor;
        BOOL hasProperty;

        hasProperty = JavascriptOperators::GetOwnPropertyDescriptor(targetObj, propertyId, requestContext, &targetDescriptor);
        if (hasProperty)
        {
            if (targetDescriptor.ValueSpecified())
            {
                if (!targetDescriptor.IsConfigurable() && !targetDescriptor.IsWritable() &&
                    !JavascriptConversion::SameValue(newValue, targetDescriptor.GetValue()))
                {
                    JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("set"));
                }
            }
            else
            {
                if (!targetDescriptor.IsConfigurable() && targetDescriptor.GetSetter() == requestContext->GetLibrary()->GetDefaultAccessorFunction())
                {
                    JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("set"));
                }
            }
        }

        threadContext->AddImplicitCallFlags(Js::ImplicitCall_External);

        return TRUE;

    }